

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytField.cpp
# Opt level: O1

void __thiscall ki::dml::Field<signed_char>::read_from(Field<signed_char> *this,istream *istream)

{
  ostream *poVar1;
  parse_error *this_00;
  ValueBytes<signed_char> data;
  ostringstream oss;
  char local_1b1;
  string local_1b0;
  ostringstream local_190 [376];
  
  local_1b1 = '\0';
  std::istream::read((char *)istream,(long)&local_1b1);
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    this->m_value = local_1b1;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Not enough data was available to read BYT value (",0x31);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->super_FieldBase).m_name._M_dataplus._M_p,
                      (this->super_FieldBase).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
  this_00 = (parse_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  parse_error::parse_error(this_00,&local_1b0);
  __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BytField::read_from(std::istream &istream)
	{
		ValueBytes<BYT> data;
		istream.read(data.buff, sizeof(BYT));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read BYT value (" << m_name << ").";
			throw parse_error(oss.str());
		}
		m_value = data.value;
	}